

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall Assimp::SMDImporter::CreateOutputMaterials(SMDImporter *this)

{
  uint uVar1;
  aiScene *paVar2;
  pointer pbVar3;
  aiMaterial **ppaVar4;
  aiMaterial *paVar5;
  long lVar6;
  uint iMat;
  ulong uVar7;
  int iMode;
  aiColor3D local_440;
  aiString szName;
  
  if (this->pScene != (aiScene *)0x0) {
    this->pScene->mNumMaterials =
         (uint)((ulong)((long)(this->aszTextures).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->aszTextures).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5);
    paVar2 = this->pScene;
    uVar1 = paVar2->mNumMaterials;
    ppaVar4 = (aiMaterial **)operator_new__((ulong)(uVar1 + (uVar1 == 0)) << 3);
    paVar2->mMaterials = ppaVar4;
    lVar6 = 8;
    uVar7 = 0;
    while( true ) {
      uVar1 = this->pScene->mNumMaterials;
      if (uVar1 <= uVar7) break;
      paVar5 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(paVar5);
      this->pScene->mMaterials[uVar7] = paVar5;
      szName.length = 0;
      szName.data[0] = '\0';
      memset(szName.data + 1,0x1b,0x3ff);
      szName.length = snprintf(szName.data,0x400,"Texture_%u");
      aiMaterial::AddProperty(paVar5,&szName,"?mat.name",0,0);
      pbVar3 = (this->aszTextures).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar6) != 0) {
        strncpy(szName.data,*(char **)((long)pbVar3 + lVar6 + -8),0x3ff);
        szName.length = *(ai_uint32 *)((long)&(pbVar3->_M_dataplus)._M_p + lVar6);
        aiMaterial::AddProperty(paVar5,&szName,"$tex.file",1,0);
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x20;
    }
    if (uVar1 == 0) {
      this->pScene->mNumMaterials = 1;
      paVar5 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(paVar5);
      *this->pScene->mMaterials = paVar5;
      iMode = 2;
      aiMaterial::AddProperty<int>(paVar5,&iMode,1,"$mat.shadingm",0,0);
      local_440._0_8_ = 0x3f3333333f333333;
      local_440.b = 0.7;
      aiMaterial::AddProperty<aiColor3D>(paVar5,&local_440,1,"$clr.diffuse",0,0);
      aiMaterial::AddProperty<aiColor3D>(paVar5,&local_440,1,"$clr.specular",0,0);
      local_440.r = 0.05;
      local_440.g = 0.05;
      local_440.b = 0.05;
      aiMaterial::AddProperty<aiColor3D>(paVar5,&local_440,1,"$clr.ambient",0,0);
      szName.length = 0;
      szName.data[0] = '\0';
      memset(szName.data + 1,0x1b,0x3ff);
      aiString::Set(&szName,"DefaultMaterial");
      aiMaterial::AddProperty(paVar5,&szName,"?mat.name",0,0);
    }
    return;
  }
  __assert_fail("nullptr != pScene",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SMD/SMDLoader.cpp"
                ,0x25a,"void Assimp::SMDImporter::CreateOutputMaterials()");
}

Assistant:

void SMDImporter::CreateOutputMaterials() {
    ai_assert( nullptr != pScene );

    pScene->mNumMaterials = (unsigned int)aszTextures.size();
    pScene->mMaterials = new aiMaterial*[std::max(1u, pScene->mNumMaterials)];

    for (unsigned int iMat = 0; iMat < pScene->mNumMaterials; ++iMat) {
        aiMaterial* pcMat = new aiMaterial();
        ai_assert( nullptr != pcMat );
        pScene->mMaterials[iMat] = pcMat;

        aiString szName;
        szName.length = (size_t)ai_snprintf(szName.data,MAXLEN,"Texture_%u",iMat);
        pcMat->AddProperty(&szName,AI_MATKEY_NAME);

        if (aszTextures[iMat].length())
        {
            ::strncpy(szName.data, aszTextures[iMat].c_str(),MAXLEN-1);
            szName.length = aszTextures[iMat].length();
            pcMat->AddProperty(&szName,AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
    }

    // create a default material if necessary
    if (0 == pScene->mNumMaterials) {
        pScene->mNumMaterials = 1;

        aiMaterial* pcHelper = new aiMaterial();
        pScene->mMaterials[0] = pcHelper;

        int iMode = static_cast<int>(aiShadingMode_Gouraud);
        pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.7f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        aiString szName;
        szName.Set(AI_DEFAULT_MATERIAL_NAME);
        pcHelper->AddProperty(&szName,AI_MATKEY_NAME);
    }
}